

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cpp
# Opt level: O0

void precalc(GameBoard *gameBoard,int *myele,int *enemyele,int *enemyht)

{
  undefined8 uVar1;
  undefined4 uVar2;
  int color;
  Tetris te;
  Tetris te_00;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  int *piVar12;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  Board brd_1;
  int ele_1;
  int ht_1;
  Tetris *loc_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Tetris,_std::allocator<Tetris>_> *__range1_1;
  Board brd;
  int ele;
  int ht;
  Tetris *loc;
  iterator __end1;
  iterator __begin1;
  vector<Tetris,_std::allocator<Tetris>_> *__range1;
  vector<Tetris,_std::allocator<Tetris>_> enemyloc;
  vector<Tetris,_std::allocator<Tetris>_> myloc;
  GameBoard *in_stack_fffffffffffffd78;
  GameBoard *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd8c;
  Board *in_stack_fffffffffffffd90;
  Block *pBVar13;
  Board *in_stack_fffffffffffffda0;
  Block local_208 [6];
  undefined1 in_stack_fffffffffffffe5f;
  vector<Tetris,_std::allocator<Tetris>_> *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  GameBoard *in_stack_fffffffffffffe70;
  int local_170;
  int local_16c;
  reference local_168;
  Tetris *local_160;
  __normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_> local_158;
  undefined1 *local_150;
  GameBoard *local_148;
  GameBoard *pGStack_140;
  undefined8 local_138;
  Board *pBStack_130;
  Block *local_128;
  Block local_120 [9];
  int local_88 [2];
  reference local_80;
  Tetris *local_78;
  __normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_> local_70;
  undefined1 *local_68;
  undefined1 local_60 [40];
  undefined1 local_38 [24];
  int *local_20;
  int *local_18;
  int *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<Tetris,_std::allocator<Tetris>_>::vector
            ((vector<Tetris,_std::allocator<Tetris>_> *)0x142659);
  GameBoard::getPlaces
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
  std::vector<Tetris,_std::allocator<Tetris>_>::vector
            ((vector<Tetris,_std::allocator<Tetris>_> *)0x14268a);
  GameBoard::getPlaces
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
  *local_10 = 0;
  *local_18 = 0;
  *local_20 = 0x14;
  local_68 = local_38;
  local_70._M_current =
       (Tetris *)
       std::vector<Tetris,_std::allocator<Tetris>_>::begin
                 ((vector<Tetris,_std::allocator<Tetris>_> *)in_stack_fffffffffffffd78);
  local_78 = (Tetris *)
             std::vector<Tetris,_std::allocator<Tetris>_>::end
                       ((vector<Tetris,_std::allocator<Tetris>_> *)in_stack_fffffffffffffd78);
  color = in_stack_fffffffffffffd8c;
  while( true ) {
    bVar11 = __gnu_cxx::operator!=
                       ((__normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_>
                         *)in_stack_fffffffffffffd80,
                        (__normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_>
                         *)in_stack_fffffffffffffd78);
    if (!bVar11) break;
    local_80 = __gnu_cxx::__normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_>
               ::operator*(&local_70);
    Board::Board(in_stack_fffffffffffffd90,color,in_stack_fffffffffffffd80);
    pBVar13 = *(Block **)&local_80->color;
    in_stack_fffffffffffffd78 = local_80->gameBoard;
    in_stack_fffffffffffffd80 = *(GameBoard **)&local_80->blockType;
    uVar1._0_4_ = local_80->blockY;
    uVar1._4_4_ = local_80->orientation;
    uVar3 = local_80->gameBoard;
    uVar4 = local_80->blockType;
    uVar5 = local_80->blockX;
    uVar6 = local_80->blockY;
    te.blockY = uVar6;
    te.blockX = uVar5;
    te.blockType = uVar4;
    te.gameBoard = (GameBoard *)uVar3;
    in_stack_fffffffffffffd90 = (Board *)local_80->shape;
    te.orientation = uVar1._4_4_;
    te.shape = (int (*) [8])in_stack_fffffffffffffd90;
    te._32_8_ = pBVar13;
    local_148 = in_stack_fffffffffffffd78;
    pGStack_140 = in_stack_fffffffffffffd80;
    local_138 = uVar1;
    pBStack_130 = in_stack_fffffffffffffd90;
    local_128 = pBVar13;
    Block::Block(local_120,te);
    eval(in_stack_fffffffffffffda0,pBVar13,in_stack_fffffffffffffd90->rows,
         (int *)CONCAT44(uVar1._4_4_,(undefined4)uVar1));
    piVar12 = std::max<int>(local_10,local_88);
    *local_10 = *piVar12;
    __gnu_cxx::__normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_>::
    operator++(&local_70);
    color = uVar1._4_4_;
  }
  local_150 = local_60;
  local_158._M_current =
       (Tetris *)
       std::vector<Tetris,_std::allocator<Tetris>_>::begin
                 ((vector<Tetris,_std::allocator<Tetris>_> *)in_stack_fffffffffffffd78);
  local_160 = (Tetris *)
              std::vector<Tetris,_std::allocator<Tetris>_>::end
                        ((vector<Tetris,_std::allocator<Tetris>_> *)in_stack_fffffffffffffd78);
  while( true ) {
    bVar11 = __gnu_cxx::operator!=
                       ((__normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_>
                         *)in_stack_fffffffffffffd80,
                        (__normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_>
                         *)in_stack_fffffffffffffd78);
    if (!bVar11) break;
    local_168 = __gnu_cxx::
                __normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_>::
                operator*(&local_158);
    Board::Board(in_stack_fffffffffffffd90,color,in_stack_fffffffffffffd80);
    pBVar13 = *(Block **)&local_168->color;
    in_stack_fffffffffffffd78 = local_168->gameBoard;
    in_stack_fffffffffffffd80 = *(GameBoard **)&local_168->blockType;
    uVar2 = local_168->blockY;
    color = local_168->orientation;
    uVar7 = local_168->gameBoard;
    uVar8 = local_168->blockType;
    uVar9 = local_168->blockX;
    uVar10 = local_168->blockY;
    te_00.blockY = uVar10;
    te_00.blockX = uVar9;
    te_00.blockType = uVar8;
    te_00.gameBoard = (GameBoard *)uVar7;
    in_stack_fffffffffffffd90 = (Board *)local_168->shape;
    te_00.orientation = color;
    te_00.shape = (int (*) [8])in_stack_fffffffffffffd90;
    te_00._32_8_ = pBVar13;
    Block::Block(local_208,te_00);
    eval(in_stack_fffffffffffffda0,pBVar13,in_stack_fffffffffffffd90->rows,
         (int *)CONCAT44(color,uVar2));
    piVar12 = std::max<int>(local_18,&local_170);
    *local_18 = *piVar12;
    in_stack_fffffffffffffda0 = (Board *)std::min<int>(local_20,&local_16c);
    *local_20 = in_stack_fffffffffffffda0->rows[0];
    __gnu_cxx::__normal_iterator<Tetris_*,_std::vector<Tetris,_std::allocator<Tetris>_>_>::
    operator++(&local_158);
  }
  std::vector<Tetris,_std::allocator<Tetris>_>::~vector
            ((vector<Tetris,_std::allocator<Tetris>_> *)in_stack_fffffffffffffd90);
  std::vector<Tetris,_std::allocator<Tetris>_>::~vector
            ((vector<Tetris,_std::allocator<Tetris>_> *)in_stack_fffffffffffffd90);
  return;
}

Assistant:

void precalc(GameBoard& gameBoard, int& myele, int& enemyele, int& enemyht) {
    std::vector<Tetris> myloc;
    gameBoard.getPlaces(gameBoard.currBotColor, gameBoard.currBlockType, myloc);
    std::vector<Tetris> enemyloc;
    gameBoard.getPlaces(gameBoard.enemyColor, gameBoard.enemyType, enemyloc);
    myele = 0;
    enemyele = 0;
    enemyht = 20;
    for (auto& loc : myloc) {
        int ht, ele;
        Board brd = Board(gameBoard.currBotColor, gameBoard);
        eval(brd, Block(loc), ele, ht);
        myele = std::max(myele, ele);
    }
    for (auto& loc : enemyloc) {
        int ht, ele;
        Board brd = Board(gameBoard.enemyColor, gameBoard);
        eval(brd, Block(loc), ele, ht);
        enemyele = std::max(enemyele, ele);
        enemyht = std::min(enemyht, ht);
    }
}